

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void FSE_initDState(FSE_DState_t *DStatePtr,BIT_DStream_t *bitD,FSE_DTable *dt)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  FSE_DTable FVar4;
  uint uVar5;
  
  FVar4 = *dt;
  uVar5 = bitD->bitsConsumed + (uint)(ushort)FVar4;
  bitD->bitsConsumed = uVar5;
  DStatePtr->state =
       ~(-1L << ((byte)(ushort)FVar4 & 0x3f)) & bitD->bitContainer >> (-(char)uVar5 & 0x3fU);
  if (uVar5 < 0x41) {
    pcVar1 = bitD->ptr;
    if (pcVar1 < bitD->limitPtr) {
      pcVar2 = bitD->start;
      if (pcVar1 != pcVar2) {
        uVar3 = (int)pcVar1 - (int)pcVar2;
        if (pcVar2 <= pcVar1 + -(ulong)(uVar5 >> 3)) {
          uVar3 = uVar5 >> 3;
        }
        bitD->ptr = pcVar1 + -(ulong)uVar3;
        bitD->bitsConsumed = uVar5 + uVar3 * -8;
        bitD->bitContainer = *(size_t *)(pcVar1 + -(ulong)uVar3);
      }
    }
    else {
      BIT_reloadDStreamFast(bitD);
    }
  }
  DStatePtr->table = dt + 1;
  return;
}

Assistant:

MEM_STATIC void FSE_initDState(FSE_DState_t* DStatePtr, BIT_DStream_t* bitD, const FSE_DTable* dt)
{
    const void* ptr = dt;
    const FSE_DTableHeader* const DTableH = (const FSE_DTableHeader*)ptr;
    DStatePtr->state = BIT_readBits(bitD, DTableH->tableLog);
    BIT_reloadDStream(bitD);
    DStatePtr->table = dt + 1;
}